

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

bool ApplyEnclosesArgs(ParseNode *fncDecl,ByteCodeGenerator *byteCodeGenerator)

{
  bool bVar1;
  ParseNodeFnc *pPVar2;
  byte local_24;
  ApplyCheck local_23;
  ByteCodeGenerator *pBStack_20;
  ApplyCheck applyCheck;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *fncDecl_local;
  
  pBStack_20 = byteCodeGenerator;
  bVar1 = ByteCodeGenerator::IsInDebugMode(byteCodeGenerator);
  if ((((!bVar1) && (bVar1 = ParseNode::HasVarArguments(fncDecl), !bVar1)) &&
      (pPVar2 = ParseNode::AsParseNodeFnc(fncDecl), pPVar2->pnodeParams == (ParseNodePtr)0x0)) &&
     ((pPVar2 = ParseNode::AsParseNodeFnc(fncDecl), pPVar2->pnodeRest == (ParseNodePtr)0x0 &&
      (pPVar2 = ParseNode::AsParseNodeFnc(fncDecl), pPVar2->nestedCount == 0)))) {
    local_23.matches = true;
    local_23.sawApply = false;
    local_23.insideApplyCall = false;
    pPVar2 = ParseNode::AsParseNodeFnc(fncDecl);
    VisitIndirect<ApplyCheck>
              (pPVar2->pnodeBody,pBStack_20,&local_23,CheckApplyEnclosesArgs,
               PostCheckApplyEnclosesArgs);
    local_24 = 0;
    if ((local_23.matches & 1U) != 0) {
      local_24 = local_23.sawApply;
    }
    return (bool)(local_24 & 1);
  }
  return false;
}

Assistant:

bool ApplyEnclosesArgs(ParseNode* fncDecl, ByteCodeGenerator* byteCodeGenerator)
{
    if (byteCodeGenerator->IsInDebugMode())
    {
        // Inspection of the arguments object will be messed up if we do ApplyArgs.
        return false;
    }

    if (!fncDecl->HasVarArguments()
        && fncDecl->AsParseNodeFnc()->pnodeParams == nullptr
        && fncDecl->AsParseNodeFnc()->pnodeRest == nullptr
        && fncDecl->AsParseNodeFnc()->nestedCount == 0)
    {
        ApplyCheck applyCheck;
        applyCheck.matches = true;
        applyCheck.sawApply = false;
        applyCheck.insideApplyCall = false;
        VisitIndirect<ApplyCheck>(fncDecl->AsParseNodeFnc()->pnodeBody, byteCodeGenerator, &applyCheck, &CheckApplyEnclosesArgs, &PostCheckApplyEnclosesArgs);
        return applyCheck.matches&&applyCheck.sawApply;
    }

    return false;
}